

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

string * jwt::base::decode(string *__return_storage_ptr__,string *base,array<char,_64UL> *alphabet,
                          string *fill)

{
  array<char,_64UL> *paVar1;
  __type _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  runtime_error *prVar11;
  size_t sVar12;
  char cStack_b3;
  char cStack_b2;
  uint32_t triple;
  uint32_t triple_1;
  uint32_t sextet_d;
  uint32_t sextet_c;
  uint32_t sextet_b;
  uint32_t sextet_a;
  size_t i;
  size_t fast_size;
  anon_class_16_2_896cead7 get_sextet;
  size_t out_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  size_t fill_cnt;
  size_t size;
  string *fill_local;
  array<char,_64UL> *alphabet_local;
  string *base_local;
  string *res;
  
  size = (size_t)fill;
  fill_local = (string *)alphabet;
  alphabet_local = (array<char,_64UL> *)base;
  base_local = __return_storage_ptr__;
  fill_cnt = std::__cxx11::string::size();
  local_38 = 0;
  while (sVar12 = fill_cnt, uVar9 = std::__cxx11::string::size(), paVar1 = alphabet_local,
        uVar9 < sVar12) {
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_58,(ulong)paVar1);
    _Var2 = std::operator==(&local_58,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            size);
    std::__cxx11::string::~string((string *)&local_58);
    if (!_Var2) break;
    local_38 = local_38 + 1;
    lVar10 = std::__cxx11::string::size();
    fill_cnt = fill_cnt - lVar10;
    if (2 < local_38) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"Invalid input");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if ((fill_cnt + local_38 & 3) != 0) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"Invalid input");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  get_sextet.base._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  fast_size = (size_t)fill_local;
  get_sextet.alphabet = alphabet_local;
  uVar9 = fill_cnt - (fill_cnt & 3);
  _sextet_b = 0;
  while (_sextet_b < uVar9) {
    uVar3 = decode::anon_class_16_2_896cead7::operator()
                      ((anon_class_16_2_896cead7 *)&fast_size,_sextet_b);
    uVar4 = decode::anon_class_16_2_896cead7::operator()
                      ((anon_class_16_2_896cead7 *)&fast_size,_sextet_b + 1);
    sVar12 = _sextet_b + 3;
    uVar5 = decode::anon_class_16_2_896cead7::operator()
                      ((anon_class_16_2_896cead7 *)&fast_size,_sextet_b + 2);
    _sextet_b = _sextet_b + 4;
    uVar6 = decode::anon_class_16_2_896cead7::operator()
                      ((anon_class_16_2_896cead7 *)&fast_size,sVar12);
    iVar7 = uVar3 * 0x40000 + uVar4 * 0x1000 + uVar5 * 0x40 + uVar6;
    triple._2_1_ = (char)((uint)iVar7 >> 0x10);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,triple._2_1_);
    triple._1_1_ = (char)((uint)iVar7 >> 8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,triple._1_1_);
    triple._0_1_ = (char)iVar7;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)triple);
  }
  if (local_38 != 0) {
    uVar3 = decode::anon_class_16_2_896cead7::operator()
                      ((anon_class_16_2_896cead7 *)&fast_size,uVar9);
    uVar4 = decode::anon_class_16_2_896cead7::operator()
                      ((anon_class_16_2_896cead7 *)&fast_size,uVar9 + 1);
    uVar8 = uVar3 * 0x40000 + uVar4 * 0x1000;
    if (local_38 == 1) {
      uVar3 = decode::anon_class_16_2_896cead7::operator()
                        ((anon_class_16_2_896cead7 *)&fast_size,uVar9 + 2);
      uVar8 = uVar8 | uVar3 << 6;
      cStack_b2 = (char)(uVar8 >> 0x10);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cStack_b2);
      cStack_b3 = (char)(uVar8 >> 8);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cStack_b3);
    }
    else if (local_38 == 2) {
      cStack_b2 = (char)(uVar8 >> 0x10);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cStack_b2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string decode(const std::string& base, const std::array<char, 64>& alphabet, const std::string& fill) {
			size_t size = base.size();

			size_t fill_cnt = 0;
			while (size > fill.size()) {
				if (base.substr(size - fill.size(), fill.size()) == fill) {
					fill_cnt++;
					size -= fill.size();
					if(fill_cnt > 2)
						throw std::runtime_error("Invalid input");
				}
				else break;
			}

			if ((size + fill_cnt) % 4 != 0)
				throw std::runtime_error("Invalid input");

			size_t out_size = size / 4 * 3;
			std::string res;
			res.reserve(out_size);

			auto get_sextet = [&](size_t offset) {
				for (size_t i = 0; i < alphabet.size(); i++) {
					if (alphabet[i] == base[offset])
						return static_cast<uint32_t>(i);
				}
				throw std::runtime_error("Invalid input");
			};

			
			size_t fast_size = size - size % 4;
			for (size_t i = 0; i < fast_size;) {
				uint32_t sextet_a = get_sextet(i++);
				uint32_t sextet_b = get_sextet(i++);
				uint32_t sextet_c = get_sextet(i++);
				uint32_t sextet_d = get_sextet(i++);

				uint32_t triple = (sextet_a << 3 * 6)
					+ (sextet_b << 2 * 6)
					+ (sextet_c << 1 * 6)
					+ (sextet_d << 0 * 6);

				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				res += (triple >> 0 * 8) & 0xFF;
			}

			if (fill_cnt == 0)
				return res;

			uint32_t triple = (get_sextet(fast_size) << 3 * 6)
				+ (get_sextet(fast_size + 1) << 2 * 6);

			switch (fill_cnt) {
			case 1:
				triple |= (get_sextet(fast_size + 2) << 1 * 6);
				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				break;
			case 2:
				res += (triple >> 2 * 8) & 0xFF;
				break;
			default:
				break;
			}

			return res;
		}